

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O1

void sv_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  long lVar2;
  undefined8 *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  uv_udp_send_t *handle;
  int in_R8D;
  
  lVar3 = CONCAT44(in_register_00000034,status);
  if (req == (uv_udp_send_t *)0x0) {
    sv_send_cb_cold_3();
    handle = req;
LAB_0017979e:
    sv_send_cb_cold_1();
  }
  else {
    handle = req;
    if (status != 0) goto LAB_0017979e;
    handle = (uv_udp_send_t *)req->handle;
    if (handle == (uv_udp_send_t *)&client || handle == (uv_udp_send_t *)&server) {
      uv_close((uv_handle_t *)handle,close_cb);
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
  }
  sv_send_cb_cold_2();
  lVar2 = CONCAT71(0x5814,handle == (uv_udp_send_t *)&client || handle == (uv_udp_send_t *)&server);
  if (handle == (uv_udp_send_t *)&client || handle == (uv_udp_send_t *)&server) {
    iVar1 = uv_is_closing((uv_handle_t *)handle);
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  if (handle == (uv_udp_send_t *)&client || handle == (uv_udp_send_t *)&server) {
    if (in_R8D != 0) goto LAB_00179845;
    if (lVar3 < 0) goto LAB_0017984a;
    if (lVar3 == 0) {
      if (lVar2 == 0) {
        return;
      }
      goto LAB_0017985e;
    }
    if (lVar2 == 0) goto LAB_0017984f;
    if (lVar3 != 4) goto LAB_00179854;
    if (*(int *)*extraout_RDX == 0x474e4f50) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close((uv_handle_t *)handle,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_1();
LAB_00179845:
    cl_recv_cb_cold_2();
LAB_0017984a:
    cl_recv_cb_cold_7();
LAB_0017984f:
    cl_recv_cb_cold_5();
LAB_00179854:
    cl_recv_cb_cold_3();
  }
  cl_recv_cb_cold_4();
LAB_0017985e:
  cl_recv_cb_cold_6();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  sv_send_cb_called++;

  if (sv_send_cb_called == 2)
    uv_close((uv_handle_t*) req->handle, close_cb);
}